

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-pump.c
# Opt level: O3

int run_helper_pipe_pump_server(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  
  type = 1;
  loop = uv_default_loop();
  server = (uv_stream_t *)&pipeServer;
  iVar1 = uv_pipe_init(loop,&pipeServer,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_bind(&pipeServer,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_0010cc24;
    iVar1 = uv_listen((uv_stream_t *)&pipeServer,1000,connection_cb);
    if (iVar1 == 0) {
      notify_parent_process();
      uv_run(loop,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0010cc2e;
    }
  }
  else {
    run_helper_pipe_pump_server_cold_1();
LAB_0010cc24:
    run_helper_pipe_pump_server_cold_2();
  }
  run_helper_pipe_pump_server_cold_3();
LAB_0010cc2e:
  run_helper_pipe_pump_server_cold_4();
  tcp_pump(100);
  return 0;
}

Assistant:

HELPER_IMPL(pipe_pump_server) {
  int r;
  type = PIPE;

  loop = uv_default_loop();

  /* Server */
  server = (uv_stream_t*)&pipeServer;
  r = uv_pipe_init(loop, &pipeServer, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&pipeServer, TEST_PIPENAME);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&pipeServer, MAX_WRITE_HANDLES, connection_cb);
  ASSERT(r == 0);

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}